

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O0

Error __thiscall asmjit::X86Compiler::finalize(X86Compiler *this)

{
  CodeBuilder *in_RDI;
  X86Assembler a;
  CBPass *pass;
  size_t len;
  size_t i;
  ZoneVector<asmjit::CBPass_*> *passes;
  Error err;
  char *in_stack_000002b0;
  int in_stack_000002bc;
  char *in_stack_000002c0;
  CodeHolder *code;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  CBNode *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  Zone *in_stack_fffffffffffffee0;
  Slot *local_58;
  CBNode *local_50;
  CBNode *local_48;
  CBNode *local_40;
  int local_34;
  Error local_24;
  ZoneVector<asmjit::CBPass_*> *local_20;
  CBNode *local_18;
  CBNode *local_10;
  CBNode *local_8;
  
  if ((in_RDI->super_CodeEmitter)._lastError == 0) {
    if (in_RDI[1].super_CodeEmitter._extraOp.field_0._packed[0].i64 != 0) {
      CodeBuilder::addNode(in_RDI,in_stack_fffffffffffffec8);
      in_RDI[1].super_CodeEmitter._extraOp.field_0._packed[0] = (UInt64)0x0;
    }
    local_34 = 0;
    local_40 = (CBNode *)&in_RDI->_cbPasses;
    local_48 = (CBNode *)0x0;
    local_50 = (CBNode *)(in_RDI->_cbPasses).super_ZoneVectorBase._length;
    local_20 = (ZoneVector<asmjit::CBPass_*> *)local_40;
    for (; local_48 < local_50; local_48 = (CBNode *)((long)&local_48->_prev + 1)) {
      local_10 = local_40;
      local_18 = local_48;
      if (local_40->_next <= local_48) {
        DebugUtils::assertionFailed(in_stack_000002c0,in_stack_000002bc,in_stack_000002b0);
      }
      local_8 = local_40;
      local_58 = *(Slot **)((long)((ZoneVectorBase *)&local_40->_prev)->_data + (long)local_48 * 8);
      in_stack_fffffffffffffec8 = local_40;
      local_34 = (*(code *)local_58->next[2].next)(local_58,&in_RDI->_cbPassZone);
      Zone::reset(in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
      if (local_34 != 0) break;
    }
    Zone::reset(in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
    if (local_34 == 0) {
      if (((in_RDI->super_CodeEmitter)._code)->_cgAsm == (Assembler *)0x0) {
        code = (CodeHolder *)&stack0xfffffffffffffee8;
        X86Assembler::X86Assembler
                  ((X86Assembler *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   code);
        local_24 = (*(in_RDI->super_CodeEmitter)._vptr_CodeEmitter[0x10])(in_RDI,code);
        X86Assembler::~X86Assembler((X86Assembler *)0x149968);
      }
      else {
        local_24 = (*(in_RDI->super_CodeEmitter)._vptr_CodeEmitter[0x10])
                             (in_RDI,((in_RDI->super_CodeEmitter)._code)->_cgAsm);
      }
    }
    else {
      local_24 = CodeEmitter::setLastError
                           ((CodeEmitter *)
                            CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                            (Error)((ulong)in_RDI >> 0x20),(char *)in_stack_fffffffffffffec8);
    }
  }
  else {
    local_24 = (in_RDI->super_CodeEmitter)._lastError;
  }
  return local_24;
}

Assistant:

Error X86Compiler::finalize() {
  if (_lastError) return _lastError;

  // Flush the global constant pool.
  if (_globalConstPool) {
    addNode(_globalConstPool);
    _globalConstPool = nullptr;
  }

  Error err = kErrorOk;
  ZoneVector<CBPass*>& passes = _cbPasses;

  for (size_t i = 0, len = passes.getLength(); i < len; i++) {
    CBPass* pass = passes[i];
    err = pass->process(&_cbPassZone);
    _cbPassZone.reset();
    if (err) break;
  }

  _cbPassZone.reset();
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  // TODO: There must be possibility to attach more assemblers, this is not so nice.
  if (_code->_cgAsm) {
    return serialize(_code->_cgAsm);
  }
  else {
    X86Assembler a(_code);
    return serialize(&a);
  }
}